

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O0

void BrotliSplitBlock(MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
                     size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split,
                     BlockSplitFromDecoder *literals_block_splits_decoder,
                     size_t *current_block_literals,BlockSplitFromDecoder *cmds_block_splits_decoder
                     ,size_t *current_block_cmds)

{
  size_t n;
  uint16_t *local_98;
  uint16_t *local_90;
  uint8_t *local_88;
  Command *cmd;
  size_t i_1;
  size_t j;
  uint16_t *distance_prefixes;
  size_t i;
  uint16_t *insert_and_copy_codes;
  uint8_t *literals;
  size_t literals_count;
  size_t mask_local;
  size_t pos_local;
  uint8_t *data_local;
  size_t num_commands_local;
  Command *cmds_local;
  MemoryManager *m_local;
  
  n = CountLiterals(cmds,num_commands);
  if (n == 0) {
    local_88 = (uint8_t *)0x0;
  }
  else {
    local_88 = (uint8_t *)BrotliAllocate(m,n);
  }
  CopyLiteralsToByteArray(cmds,num_commands,data,pos,mask,local_88);
  if (literals_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    SplitByteVectorLiteral(m,local_88,n,0x220,100,0x46,28.1,params,literal_split);
  }
  else {
    BrotliSplitBlockLiteralsFromStored
              (m,cmds,num_commands,pos,mask,literal_split,literals_block_splits_decoder,
               current_block_literals);
  }
  BrotliFree(m,local_88);
  if (num_commands == 0) {
    local_90 = (uint16_t *)0x0;
  }
  else {
    local_90 = (uint16_t *)BrotliAllocate(m,num_commands << 1);
  }
  for (distance_prefixes = (uint16_t *)0x0; distance_prefixes < num_commands;
      distance_prefixes = (uint16_t *)((long)distance_prefixes + 1)) {
    local_90[(long)distance_prefixes] = cmds[(long)distance_prefixes].cmd_prefix_;
  }
  if (cmds_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    SplitByteVectorCommand
              (m,local_90,num_commands,0x212,0x32,0x28,13.5,params,insert_and_copy_split);
  }
  else {
    BrotliSplitBlockCommandsFromStored
              (m,cmds,num_commands,pos,mask,insert_and_copy_split,cmds_block_splits_decoder,
               current_block_cmds);
  }
  BrotliFree(m,local_90);
  if (num_commands == 0) {
    local_98 = (uint16_t *)0x0;
  }
  else {
    local_98 = (uint16_t *)BrotliAllocate(m,num_commands << 1);
  }
  i_1 = 0;
  for (cmd = (Command *)0x0; cmd < num_commands; cmd = (Command *)((long)&cmd->insert_len_ + 1)) {
    if (((cmds[(long)cmd].copy_len_ & 0x1ffffff) != 0) && (0x7f < cmds[(long)cmd].cmd_prefix_)) {
      local_98[i_1] = cmds[(long)cmd].dist_prefix_ & 0x3ff;
      i_1 = i_1 + 1;
    }
  }
  if (literals_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    SplitByteVectorDistance(m,local_98,i_1,0x220,0x32,0x28,14.6,params,dist_split);
  }
  else {
    SplitByteVectorDistance(m,local_98,i_1,0x220,1,0x28,14.6,params,dist_split);
  }
  BrotliFree(m,local_98);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split,
                      const BlockSplitFromDecoder* literals_block_splits_decoder,
                      size_t* current_block_literals,
                      const BlockSplitFromDecoder* cmds_block_splits_decoder,
                      size_t* current_block_cmds) {

  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);

    /* Create the block split on the array of literals.
-       Literal histograms have alphabet size 256.
       If have block splits from decoder then use them. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorLiteral(
          m, literals, literals_count,
          kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
          kLiteralStrideLength, kLiteralBlockSwitchCost, params,
          literal_split);
    } else {
      BrotliSplitBlockLiteralsFromStored(m, cmds, num_commands, pos, mask,
                                         literal_split,
                                         literals_block_splits_decoder,
                                         current_block_literals);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }

    /* Create the block split on the array of command prefixes.
       If have block splits from decoder then use them. */
    if (cmds_block_splits_decoder == NULL) {
      SplitByteVectorCommand(
          m, insert_and_copy_codes, num_commands,
          kSymbolsPerCommandHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kCommandBlockSwitchCost, params,
          insert_and_copy_split);
    } else {
      BrotliSplitBlockCommandsFromStored(m, cmds, num_commands, pos, mask,
                                         insert_and_copy_split,
                                         cmds_block_splits_decoder,
                                         current_block_cmds);
    }
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    } else {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, 1,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}